

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O0

void __thiscall AnalyzerDecl::GenInitCode(AnalyzerDecl *this,Output *out_cc)

{
  bool bVar1;
  iterator __lhs;
  Output *in_RSI;
  AnalyzerDecl *in_RDI;
  Output *unaff_retaddr;
  Output *in_stack_00000008;
  iterator i;
  __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
  local_18 [2];
  AnalyzerDecl *decl;
  
  decl = in_RDI;
  TypeDecl::GenInitCode(&in_RDI->super_TypeDecl,in_RSI);
  if (in_RDI->constructor_helpers_ != (AnalyzerHelperList *)0x0) {
    local_18[0]._M_current =
         (AnalyzerHelper **)
         std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::begin
                   ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)in_RDI);
    while( true ) {
      __lhs = std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>::end
                        ((vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_> *)in_RDI);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)__lhs._M_current,
                         (__normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
                          *)in_RDI);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
      ::operator*(local_18);
      AnalyzerHelper::GenCode((AnalyzerHelper *)i._M_current,in_stack_00000008,unaff_retaddr,decl);
      __gnu_cxx::
      __normal_iterator<AnalyzerHelper_**,_std::vector<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>_>
      ::operator++(local_18);
    }
  }
  return;
}

Assistant:

void AnalyzerDecl::GenInitCode(Output* out_cc)
	{
	TypeDecl::GenInitCode(out_cc);
	foreach (i, AnalyzerHelperList, constructor_helpers_)
		{
		(*i)->GenCode(nullptr, out_cc, this);
		}
	}